

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_state_callback_clear(callback_type_e c_type)

{
  callback_collection_s *pcVar1;
  fio_lock_i fVar2;
  fio_ls_embd_s *pfVar3;
  ulong uVar4;
  fio_ls_embd_s *pfVar5;
  fio_lock_i ret;
  timespec local_28;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    uVar4 = (ulong)c_type;
    pcVar1 = callback_collection + uVar4;
    LOCK();
    fVar2 = pcVar1->lock;
    pcVar1->lock = '\x01';
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar2);
    while (fVar2 != '\0') {
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      fVar2 = pcVar1->lock;
      pcVar1->lock = '\x01';
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar2);
    }
    if (callback_collection[uVar4].callbacks.next == (fio_ls_embd_s *)0x0) {
      pfVar5 = (fio_ls_embd_s *)(uVar4 * 0x18 + 0x15bb48);
      callback_collection[uVar4].callbacks.prev = pfVar5;
      callback_collection[uVar4].callbacks.next = pfVar5;
    }
    while (pfVar5 = callback_collection[uVar4].callbacks.next,
          pfVar5 != &callback_collection[uVar4].callbacks) {
      pfVar3 = pfVar5->next;
      if (pfVar3 == pfVar5 || pfVar3 == (fio_ls_embd_s *)0x0) {
        pfVar5 = (fio_ls_embd_s *)0x0;
      }
      else {
        pfVar3->prev = pfVar5->prev;
        pfVar5->prev->next = pfVar3;
        pfVar5->next = pfVar5;
        pfVar5->prev = pfVar5;
      }
      free(pfVar5);
    }
    LOCK();
    pcVar1->lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_state_callback_clear(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  while (fio_ls_embd_any(&callback_collection[c_type].callbacks)) {
    callback_data_s *tmp = FIO_LS_EMBD_OBJ(
        callback_data_s, node,
        fio_ls_embd_shift(&callback_collection[c_type].callbacks));
    free(tmp);
  }
  fio_unlock(&callback_collection[c_type].lock);
}